

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_play_item(command *cmd)

{
  cmd_code c;
  object *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  errr eVar5;
  command_conflict *pcVar6;
  command *cmd_00;
  char *pcVar7;
  short sVar8;
  short sVar9;
  char *pcVar10;
  object *obj;
  wchar_t object_changed;
  char ch;
  wchar_t display_all_prop;
  object *orig_obj;
  object *local_38;
  object *poStack_30;
  
  obj = (object *)0x0;
  orig_obj = (object *)0x0;
  display_all_prop = L'\x01';
  object_changed = L'\0';
  wVar3 = cmd_get_arg_item((command_conflict *)cmd,"original_item",&orig_obj);
  poVar1 = orig_obj;
  wVar4 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if ((wVar3 == L'\0') && (poVar1 != (object *)0x0)) {
    if (obj == (object *)0x0 || wVar4 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x672,"void do_cmd_wiz_play_item(struct command *)");
    }
    wVar3 = cmd_get_arg_choice((command_conflict *)cmd,"all_prop",&display_all_prop);
    if (wVar3 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x677,"void do_cmd_wiz_play_item(struct command *)");
    }
    wVar3 = cmd_get_arg_choice((command_conflict *)cmd,"changed",&object_changed);
    if (wVar3 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x67c,"void do_cmd_wiz_play_item(struct command *)");
    }
  }
  else {
    if ((obj == (object *)0x0 || wVar4 != L'\0') &&
       (_Var2 = get_item(&obj,"Play with which object? ","You have nothing to play with.",cmd->code,
                         (item_tester)0x0,L'\x0f'), !_Var2)) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",obj);
    orig_obj = object_new();
    object_copy(orig_obj,obj);
    cmd_set_arg_item((command_conflict *)cmd,"original_item",orig_obj);
    wVar3 = cmd_get_arg_choice((command_conflict *)cmd,"all_prop",&display_all_prop);
    if (wVar3 != L'\0') {
      display_all_prop = L'\x01';
      cmd_set_arg_choice((command_conflict *)cmd,"all_prop",L'\x01');
    }
    wVar3 = cmd_get_arg_choice((command_conflict *)cmd,"changed",&object_changed);
    if (wVar3 != L'\0') {
      object_changed = L'\0';
      cmd_set_arg_choice((command_conflict *)cmd,"changed",L'\0');
    }
    screen_save();
  }
  wiz_display_item(obj,display_all_prop != L'\0',player);
  _Var2 = get_com("[a]ccept [s]tatistics [r]eroll [t]weak [c]urse [q]uantity [k]nown? ",&ch);
  if (!_Var2) {
    pcVar7 = "Changes ignored.";
    goto LAB_00132d51;
  }
  switch(ch) {
  case 'K':
switchD_00132d3f_caseD_6b:
    wVar3 = (wchar_t)(display_all_prop == L'\0');
    pcVar7 = "all_prop";
    cmd_00 = cmd;
    display_all_prop = wVar3;
    goto LAB_00132e87;
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
    goto switchD_00132d3f_caseD_6c;
  case 'Q':
switchD_00132d3f_caseD_71:
    c = CMD_WIZ_CHANGE_ITEM_QUANTITY;
    break;
  case 'R':
switchD_00132d3f_caseD_72:
    c = CMD_WIZ_REROLL_ITEM;
    break;
  case 'S':
switchD_00132d3f_caseD_73:
    eVar5 = cmdq_push(CMD_WIZ_STAT_ITEM);
    if (eVar5 == 0) {
      pcVar6 = cmdq_peek();
      cmd_set_arg_item(pcVar6,"item",obj);
      goto switchD_00132d3f_caseD_6c;
    }
    goto LAB_00132e39;
  case 'T':
switchD_00132d3f_caseD_74:
    c = CMD_WIZ_TWEAK_ITEM;
    break;
  default:
    switch(ch) {
    case 'k':
      goto switchD_00132d3f_caseD_6b;
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
      goto switchD_00132d3f_caseD_6c;
    case 'q':
      goto switchD_00132d3f_caseD_71;
    case 'r':
      goto switchD_00132d3f_caseD_72;
    case 's':
      goto switchD_00132d3f_caseD_73;
    case 't':
      goto switchD_00132d3f_caseD_74;
    default:
      if (ch == 'A') {
LAB_00132da7:
        if (object_changed != L'\0') {
          _Var2 = object_is_carried(player,obj);
          if (_Var2) {
            if (obj->number == orig_obj->number) {
              sVar8 = obj->weight;
              sVar9 = orig_obj->weight;
              if (sVar8 == sVar9) goto LAB_00132fa8;
            }
            else {
              sVar9 = orig_obj->weight;
              sVar8 = obj->weight;
            }
            player->upkeep->total_weight =
                 (int)sVar8 * (uint)obj->number +
                 (player->upkeep->total_weight - (int)sVar9 * (uint)orig_obj->number);
          }
LAB_00132fa8:
          wiz_play_item_standard_upkeep(player,obj);
        }
        pcVar10 = (char *)0x0;
        goto LAB_00132f17;
      }
      if ((ch != 'C') && (ch != 'c')) {
        if (ch != 'a') goto switchD_00132d3f_caseD_6c;
        goto LAB_00132da7;
      }
      c = CMD_WIZ_CURSE_ITEM;
      break;
    }
  }
  eVar5 = cmdq_push(c);
  if (eVar5 == 0) {
    pcVar6 = cmdq_peek();
    cmd_set_arg_item(pcVar6,"item",obj);
    cmd_00 = (command *)cmdq_peek();
    pcVar7 = "update";
    wVar3 = L'\0';
LAB_00132e87:
    cmd_set_arg_choice((command_conflict *)cmd_00,pcVar7,wVar3);
switchD_00132d3f_caseD_6c:
    eVar5 = cmdq_push_copy((command_conflict *)cmd);
    if (eVar5 == 0) {
      return;
    }
    pcVar10 = "Couldn\'t queue command.  Changes lost.";
  }
  else {
LAB_00132e39:
    _Var2 = get_check("Couldn\'t proceed.  Stop playing with item and lose all changes? ");
    if (!_Var2) goto switchD_00132d3f_caseD_6c;
    pcVar7 = "Bailed out.  Changes to item lost.";
LAB_00132d51:
    pcVar10 = (char *)0x0;
    if (object_changed != L'\0') {
      pcVar10 = pcVar7;
    }
  }
  if (object_changed != L'\0') {
    local_38 = obj->prev;
    poStack_30 = obj->next;
    mem_free(obj->slays);
    obj->slays = (_Bool *)0x0;
    mem_free(obj->brands);
    obj->brands = (_Bool *)0x0;
    mem_free(obj->curses);
    obj->curses = (curse_data *)0x0;
    object_copy(obj,orig_obj);
    obj->prev = local_38;
    obj->next = poStack_30;
  }
LAB_00132f17:
  object_delete((chunk *)cave,(chunk *)player->cave,&orig_obj);
  cmd_set_arg_item((command_conflict *)cmd,"original_item",(object *)0x0);
  cmd_set_arg_choice((command_conflict *)cmd,"changed",L'\0');
  screen_load();
  if (pcVar10 != (char *)0x0) {
    msg("%s",pcVar10);
  }
  return;
}

Assistant:

void do_cmd_wiz_play_item(struct command *cmd)
{
	struct object *obj = NULL;
	struct object *orig_obj = NULL;
	int display_all_prop = 1;
	int object_changed = 0;
	bool done = false;
	bool rejected = true;
	const char *done_msg = NULL;
	char ch;

	/*
	 * When called to initiate a play session, "item" may be set, but
	 * "original_item" should not be set or should be set to NULL.
	 * Subsequent calls in the same session will have both set to
	 * non-NULL vales along with "all_prop" and "changed".
	 */
	if (cmd_get_arg_item(cmd, "original_item", &orig_obj) == CMD_OK &&
			orig_obj) {
		if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK || !obj) {
			assert(0);
			return;
		}
		if (cmd_get_arg_choice(cmd, "all_prop", &display_all_prop) !=
				CMD_OK) {
			assert(0);
			return;
		}
		if (cmd_get_arg_choice(cmd, "changed", &object_changed) !=
				CMD_OK) {
			assert(0);
			return;
		}
	} else {
		if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK || !obj) {
			if (!get_item(&obj, "Play with which object? ",
					"You have nothing to play with.",
					cmd->code, NULL, (USE_EQUIP |
					USE_INVEN | USE_QUIVER | USE_FLOOR))) {
				return;
			}
		}

		/* Remember the object. */
		cmd_set_arg_item(cmd, "item", obj);

		/* Make a copy so changes can be rejected. */
		orig_obj = object_new();
		object_copy(orig_obj, obj);
		cmd_set_arg_item(cmd, "original_item", orig_obj);

		/*
		 * Store whether all properties are shown or only the known
		 * ones.
		 */
		if (cmd_get_arg_choice(cmd, "all_prop", &display_all_prop) !=
				CMD_OK) {
			display_all_prop = 1;
			cmd_set_arg_choice(cmd, "all_prop", display_all_prop);
		}

		/*
		 * Store whether the working item may have changed from the
		 * original.
		 */
		if (cmd_get_arg_choice(cmd, "changed", &object_changed) !=
				CMD_OK) {
			object_changed = 0;
			cmd_set_arg_choice(cmd, "changed", object_changed);
		}

		/* Save screen. */
		screen_save();
	}

	/* Display the (possibly modified) item. */
	wiz_display_item(obj, display_all_prop != 0, player);

	/* Get choice. */
	if (get_com("[a]ccept [s]tatistics [r]eroll [t]weak [c]urse [q]uantity [k]nown? ", &ch)) {
		bool queue_failed = false;

		switch (ch) {
			case 'A':
			case 'a':
				/* Accept whatever changes were made. */
				done = true;
				rejected = false;
				if (object_changed) {
					/* Mark for updates. */
					if (object_is_carried(player, obj) &&
							(obj->number !=
							orig_obj->number ||
							obj->weight !=
							orig_obj->weight)) {
						/*
						 * Remove the weight of the old
						 * version.
						 */
						player->upkeep->total_weight -=
							orig_obj->number *
							orig_obj->weight;

						/*
						 * Add the weight of the new
						 * version.
						 */
						player->upkeep->total_weight +=
							obj->number *
							obj->weight;
					}
					wiz_play_item_standard_upkeep(player,
						obj);
				}
				break;

			case 'C':
			case 'c':
				/* Change a curse on the item. */
				if (cmdq_push(CMD_WIZ_CURSE_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'S':
			case 's':
				/* Get statistics about the item. */
				if (cmdq_push(CMD_WIZ_STAT_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
				} else {
					queue_failed = true;
				}
				break;

			case 'R':
			case 'r':
				/* Reroll the item. */
				if (cmdq_push(CMD_WIZ_REROLL_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'T':
			case 't':
				/* Tweak the object's properties. */
				if (cmdq_push(CMD_WIZ_TWEAK_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'K':
			case 'k':
				/* Toggle whether showing all properties. */
				display_all_prop = !display_all_prop;
				cmd_set_arg_choice(cmd, "all_prop",
					display_all_prop);
				break;

			case 'Q':
			case 'q':
				/* Change the number of items in the stack. */
				if (cmdq_push(CMD_WIZ_CHANGE_ITEM_QUANTITY) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			default:
				/*
				 * Don't have to do anything, next pass through
				 * will ask again what's wanted.
				 */
				break;
		}

		if (queue_failed &&
				get_check("Couldn't proceed.  Stop playing with item and lose all changes? ")) {
			done = true;
			if (object_changed) {
				done_msg = "Bailed out.  Changes to item lost.";
			}
		}
	} else {
		done = true;
		if (object_changed) {
			done_msg = "Changes ignored.";
		}
	}

	if (!done) {
		/* Push the command back on the queue to be reexecuted. */
		if (cmdq_push_copy(cmd) != 0) {
			/* Failed.  Bail out without saving changes. */
			done = true;
			done_msg = "Couldn't queue command.  Changes lost.";
		}
	}

	if (done) {
		if (rejected && object_changed) {
			/*
			 * Restore to the original values.  The pile links
			 * require special handling because object_copy()
			 * resets them.
			 */
			struct object *prev = obj->prev;
			struct object *next = obj->next;

			/* Free slays, brands, and curses by hand. */
			mem_free(obj->slays);
			obj->slays = NULL;
			mem_free(obj->brands);
			obj->brands = NULL;
			mem_free(obj->curses);
			obj->curses = NULL;

			object_copy(obj, orig_obj);
			obj->prev = prev;
			obj->next = next;
		}

		/* Release the preserved copy. */
		object_delete(cave, player->cave, &orig_obj);

		/*
		 * Reset the original_item and changed arguments so repeating
		 * the command will start a new play session without a
		 * dangling reference to the deleted preserved copy.
		 */
		cmd_set_arg_item(cmd, "original_item", NULL);
		cmd_set_arg_choice(cmd, "changed", 0);

		/* Restore the screen. */
		screen_load();

		/* Provide some feedback. */
		if (done_msg) {
			msg("%s", done_msg);
		}
	}
}